

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O3

EntryType * __thiscall
SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
::FindOrAddEntry(SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
                 *this,void *key)

{
  hash_t targetBucket;
  EntryType *pEVar1;
  
  targetBucket = PrimePolicy::ModPrime((hash_t)((ulong)key >> 4),this->size,this->modFunctionIndex);
  pEVar1 = this->table[targetBucket];
  while( true ) {
    if (pEVar1 == (EntryType *)0x0) {
      pEVar1 = AddInternal(this,key,(PinRecord)ZEXT816(0),targetBucket);
      return pEVar1;
    }
    if (pEVar1->key == key) break;
    pEVar1 = pEVar1->next;
  }
  return pEVar1;
}

Assistant:

EntryType * FindOrAddEntry(TKey key)
    {
         uint targetBucket = HashKeyToBucket(key);
         EntryType * entry = FindEntry(key, targetBucket);
         if (entry == nullptr)
         {
            entry = AddInternal(key, TData(), targetBucket);
         }
         return entry;
    }